

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O3

void __thiscall Centaurus::CharClass<char>::parse(CharClass<char> *this,Stream *stream)

{
  pointer pRVar1;
  pointer pRVar2;
  bool bVar3;
  wchar_t wVar4;
  wchar_t ch;
  wchar_t ch_00;
  StreamException *__return_storage_ptr__;
  char cVar5;
  wchar_t wVar6;
  int iVar7;
  undefined1 local_68 [9];
  char cStack_5f;
  undefined1 auStack_5e [14];
  pointer pRStack_58;
  pointer local_50;
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> local_48;
  
  wVar4 = Stream::get(stream);
  ch = wVar4;
  if (wVar4 == L'^') {
    ch = Stream::get(stream);
  }
  wVar6 = L'\0';
  iVar7 = 0;
  do {
    cVar5 = (char)wVar6;
    if (ch == L']') {
      if (iVar7 == 1) {
        local_68._0_8_ = &PTR__Range_001c49f0;
        cStack_5f = cVar5 + '\x01';
        local_68[8] = cVar5;
        operator|=(this,(Range<char> *)local_68);
      }
      else if (iVar7 == 2) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L']');
LAB_0013006b:
        __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                    StreamException::~StreamException);
      }
      pRVar1 = (this->m_ranges).
               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (this->m_ranges).
               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pRVar1 != pRVar2) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Centaurus::Range<char>*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pRVar1,pRVar2,(int)LZCOUNT((long)pRVar2 - (long)pRVar1 >> 4) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Centaurus::Range<char>*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pRVar1,pRVar2);
      }
      if (wVar4 == L'^') {
        operator~((CharClass<char> *)local_68,this);
        local_48.
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->m_ranges).
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = local_50;
        local_48.
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->m_ranges).
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_start = stack0xffffffffffffffa0;
        (this->m_ranges).
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_finish = pRStack_58;
        register0x00001200 = ZEXT816(0) << 0x20;
        local_50 = (pointer)0x0;
        std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                  (&local_48);
        ~CharClass((CharClass<char> *)local_68);
      }
      return;
    }
    if ((ch == L'\xffff') || (ch == L'\0')) {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,ch);
      goto LAB_0013006b;
    }
    ch_00 = ch;
    if (ch == L'\\') {
      ch_00 = Stream::get(stream);
      if (ch_00 < L'[') {
        if (ch_00 < L'R') {
          if (ch_00 != L'-') {
            if (ch_00 == L'N') goto LAB_0012fea9;
            goto LAB_001300bf;
          }
        }
        else if (ch_00 == L'R') {
LAB_0012fea1:
          ch_00 = L'\r';
        }
        else {
          if (ch_00 != L'T') goto LAB_001300bf;
LAB_0012fe99:
          ch_00 = L'\t';
        }
      }
      else if (ch_00 < L'n') {
        if (2 < (uint)(ch_00 + L'\xffffffa5')) {
LAB_001300bf:
          __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(__return_storage_ptr__,stream,ch_00);
          goto LAB_0013006b;
        }
      }
      else {
        if (ch_00 != L'n') {
          if (ch_00 == L'r') goto LAB_0012fea1;
          if (ch_00 == L't') goto LAB_0012fe99;
          goto LAB_001300bf;
        }
LAB_0012fea9:
        ch_00 = L'\n';
      }
    }
    bVar3 = ch_00 == L'-' && ch != L'\\';
    if (iVar7 == 2) {
      if (bVar3) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L'-');
        goto LAB_0013006b;
      }
      local_68._0_8_ = &PTR__Range_001c49f0;
      cStack_5f = (char)ch_00 + '\x01';
      local_68[8] = cVar5;
      operator|=(this,(Range<char> *)local_68);
      iVar7 = 0;
    }
    else if (iVar7 == 1) {
      iVar7 = 2;
      if (ch_00 != L'-' || ch == L'\\') {
        local_68._0_8_ = &PTR__Range_001c49f0;
        cStack_5f = cVar5 + '\x01';
        local_68[8] = cVar5;
        operator|=(this,(Range<char> *)local_68);
        iVar7 = 1;
        wVar6 = ch_00;
      }
    }
    else {
      iVar7 = 1;
      wVar6 = ch_00;
      if (bVar3) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L'-');
        goto LAB_0013006b;
      }
    }
    ch = Stream::get(stream);
  } while( true );
}

Assistant:

void CharClass<TCHAR>::parse(Stream& stream)
{
    wchar_t ch;
    bool invert_flag = false;

    ch = stream.get();
    if (ch == L'^')
    {
        invert_flag = true;
        ch = stream.get();
    }

    wchar_t start = 0;
    enum
    {
        CC_STATE_START = 0,
        CC_STATE_RANGE,
        CC_STATE_END
    } state = CC_STATE_START;
    for (; ch != L']'; ch = stream.get())
    {
        bool escaped = false;

        if (ch == L'\0' || ch == 0xFFFF)
            throw stream.unexpected(ch);

        if (ch == L'\\')
        {
            ch = stream.get();
            switch (ch)
            {
            case L'\\':
                ch = L'\\';
                break;
            case L'-':
                ch = L'-';
                break;
            case L'[':
                ch = L'[';
                break;
            case L']':
                ch = L']';
                break;
            case L't':
            case L'T':
                ch = L'\t';
                break;
            case L'r':
            case L'R':
                ch = L'\r';
                break;
            case L'n':
            case L'N':
                ch = L'\n';
                break;
            default:
                throw stream.unexpected(ch);
            }
            escaped = true;
        }
        switch (state)
        {
        case CC_STATE_START:
            if (!escaped && ch == L'-')
                throw stream.unexpected(ch);
            start = ch;
            state = CC_STATE_RANGE;
            break;
        case CC_STATE_RANGE:
            if (!escaped && ch == L'-')
            {
                state = CC_STATE_END;
            }
            else
            {
                *this |= Range<TCHAR>(start, start + 1);
                start = ch;
                state = CC_STATE_RANGE;
            }
            break;
        case CC_STATE_END:
            if (!escaped && ch == L'-')
            {
                throw stream.unexpected(ch);
            }
            else
            {
                *this |= Range<TCHAR>(start, ch + 1);
                state = CC_STATE_START;
            }
            break;
        }
    }
    if (state == CC_STATE_RANGE)
    {
        *this |= Range<TCHAR>(start, start + 1);
    }
    else if (state == CC_STATE_END)
    {
        throw stream.unexpected(L']');
    }

	std::sort(m_ranges.begin(), m_ranges.end());

	if (invert_flag)
	{
		*this = this->operator~();
	}
}